

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat::RunImpl
          (TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_1c0 [8];
  XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper fixtureHelper;
  bool ctorOk;
  TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper::
  XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper
            ((XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper *)local_1c0,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper>
            ((XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper *)local_1c0,
             &(this->super_Test).m_details);
  XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper::
  ~XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper
            ((XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper *)local_1c0);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleSuccessfulTestReportSummaryFormat)
{
    TestDetails const details("TestName", "DefaultSuite", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportSummary(1, 0, 0, 0.1f);

    const char *expected =
"<?xml version=\"1.0\"?>"
"<unittest-results tests=\"1\" failedtests=\"0\" failures=\"0\" time=\"0.1\">"
"<test suite=\"DefaultSuite\" name=\"TestName\" time=\"0\"/>"
"</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}